

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebuggerBreakpointManager.cxx
# Opt level: O0

int testDebuggerBreakpointManager(int param_1,char **param_2)

{
  initializer_list<std::function<bool_()>_> __l;
  _Any_data *local_d8;
  allocator<std::function<bool_()>_> local_a1;
  _Any_data local_a0 [2];
  function<bool()> local_80 [32];
  function<bool()> local_60 [32];
  _Any_data local_40;
  vector<std::function<bool_()>,_std::allocator<std::function<bool_()>_>_> local_30;
  char **local_18;
  char **param_1_local;
  int param_0_local;
  
  local_18 = param_2;
  param_1_local._0_4_ = param_1;
  std::function<bool()>::function<bool(&)(),void>
            ((function<bool()> *)local_a0[0]._M_pod_data,
             testHandleBreakpointRequestBeforeFileIsLoaded);
  std::function<bool()>::function<bool(&)(),void>
            (local_80,testHandleBreakpointRequestAfterFileIsLoaded);
  std::function<bool()>::function<bool(&)(),void>
            (local_60,testSourceFileLoadedAfterHandleBreakpointRequest);
  local_40._8_8_ = 3;
  local_40._M_unused._M_object = local_a0;
  std::allocator<std::function<bool_()>_>::allocator(&local_a1);
  __l._M_len = local_40._8_8_;
  __l._M_array = (iterator)local_40._M_unused._0_8_;
  std::vector<std::function<bool_()>,_std::allocator<std::function<bool_()>_>_>::vector
            (&local_30,__l,&local_a1);
  param_1_local._4_4_ = runTests(&local_30);
  std::vector<std::function<bool_()>,_std::allocator<std::function<bool_()>_>_>::~vector(&local_30);
  std::allocator<std::function<bool_()>_>::~allocator(&local_a1);
  local_d8 = &local_40;
  do {
    local_d8 = local_d8 + -2;
    std::function<bool_()>::~function((function<bool_()> *)local_d8);
  } while (local_d8 != local_a0);
  return param_1_local._4_4_;
}

Assistant:

int testDebuggerBreakpointManager(int, char*[])
{
  return runTests(std::vector<std::function<bool()>>{
    testHandleBreakpointRequestBeforeFileIsLoaded,
    testHandleBreakpointRequestAfterFileIsLoaded,
    testSourceFileLoadedAfterHandleBreakpointRequest,
  });
}